

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 target,U32 mls,int extDict)

{
  U32 UVar1;
  int iVar2;
  size_t sVar3;
  BYTE *pBVar4;
  U32 in_ECX;
  BYTE *in_RDX;
  BYTE *in_RSI;
  ZSTD_matchState_t *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  U32 positions;
  size_t matchLength;
  U32 *nextPtr;
  U32 nbCompares;
  size_t bestLength;
  U32 matchEndIdx;
  U32 windowLow;
  U32 dummy32;
  U32 *largerPtr;
  U32 *smallerPtr;
  U32 btLow;
  U32 curr;
  BYTE *match;
  BYTE *prefixStart;
  BYTE *dictEnd;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 matchIndex;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  size_t h;
  U32 hashLog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  U32 local_128;
  U32 in_stack_fffffffffffffedc;
  void *in_stack_fffffffffffffee0;
  uint local_114;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  uint *iEnd;
  undefined4 in_stack_ffffffffffffff10;
  BYTE *ip_00;
  uint local_dc;
  uint local_d4;
  uint *local_d0;
  uint *local_c8;
  uint local_c0;
  uint local_bc;
  BYTE *local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  uint local_9c;
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  BYTE *local_80;
  uint local_74;
  uint local_70;
  int local_6c;
  U32 *local_68;
  size_t local_60;
  uint local_54;
  U32 *local_50;
  ZSTD_compressionParameters *local_48;
  int local_3c;
  U32 local_34;
  BYTE *local_30;
  BYTE *local_28;
  ZSTD_matchState_t *local_20;
  uint local_14;
  size_t local_8;
  
  local_48 = &in_RDI->cParams;
  local_50 = in_RDI->hashTable;
  local_54 = (in_RDI->cParams).hashLog;
  local_14 = local_54;
  if (0x20 < local_54) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_3c = in_R9D;
  local_34 = in_ECX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  switch(in_R8D) {
  default:
    local_8 = ZSTD_hash4Ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    break;
  case 5:
    local_8 = ZSTD_hash5Ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    break;
  case 6:
    local_8 = ZSTD_hash6Ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    break;
  case 7:
    local_8 = ZSTD_hash7Ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    break;
  case 8:
    local_8 = ZSTD_hash8Ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  local_60 = local_8;
  local_68 = local_20->chainTable;
  local_6c = local_48->chainLog - 1;
  local_70 = (1 << ((byte)local_6c & 0x1f)) - 1;
  local_74 = local_50[local_8];
  local_80 = (BYTE *)0x0;
  local_88 = (BYTE *)0x0;
  local_90 = (local_20->window).base;
  local_98 = (local_20->window).dictBase;
  local_9c = (local_20->window).dictLimit;
  local_a8 = local_98 + local_9c;
  local_b0 = local_90 + local_9c;
  local_bc = (int)local_28 - (int)local_90;
  if (local_70 < local_bc) {
    local_114 = local_bc - local_70;
  }
  else {
    local_114 = 0;
  }
  local_c0 = local_114;
  local_c8 = local_68 + ((local_bc & local_70) << 1);
  local_d0 = local_c8 + 1;
  UVar1 = ZSTD_getLowestMatchIndex(local_20,local_34,local_48->windowLog);
  local_dc = local_bc + 9;
  ip_00 = (BYTE *)0x8;
  iVar2 = 1 << ((byte)local_48->searchLog & 0x1f);
  if (local_34 < local_bc) {
    __assert_fail("curr <= target",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8100,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  if (local_30 + 0xfffffffffffffff8 < local_28) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8101,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  local_50[local_60] = local_bc;
  if (UVar1 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8104,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  do {
    if (iVar2 == 0 || local_74 < UVar1) {
LAB_003e3d2a:
      *local_d0 = 0;
      *local_c8 = 0;
      local_128 = 0;
      if ((BYTE *)0x180 < ip_00) {
        if ((int)ip_00 - 0x180U < 0xc1) {
          local_128 = (int)ip_00 - 0x180;
        }
        else {
          local_128 = 0xc0;
        }
      }
      if (local_bc + 8 < local_dc) {
        if (local_128 <= local_dc - (local_bc + 8)) {
          local_128 = local_dc - (local_bc + 8);
        }
        return local_128;
      }
      __assert_fail("matchEndIdx > curr + 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8147,
                    "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                   );
    }
    iEnd = local_68 + ((local_74 & local_70) << 1);
    pBVar4 = local_88;
    if (local_80 < local_88) {
      pBVar4 = local_80;
    }
    if (local_bc <= local_74) {
      __assert_fail("matchIndex < curr",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8108,
                    "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                   );
    }
    if ((local_3c == 0) || ((BYTE *)(ulong)local_9c <= pBVar4 + local_74)) {
      if (pBVar4 + local_74 < (BYTE *)(ulong)local_9c) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8120,
                      "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                     );
      }
      local_b8 = local_90 + local_74;
      sVar3 = ZSTD_count(ip_00,(BYTE *)CONCAT44(iVar2,in_stack_ffffffffffffff10),(BYTE *)iEnd);
      pBVar4 = pBVar4 + sVar3;
    }
    else {
      local_b8 = local_98 + local_74;
      sVar3 = ZSTD_count_2segments
                        (ip_00,(BYTE *)CONCAT44(iVar2,in_stack_ffffffffffffff10),(BYTE *)iEnd,pBVar4
                         ,(BYTE *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pBVar4 = pBVar4 + sVar3;
      if ((BYTE *)(ulong)local_9c <= pBVar4 + local_74) {
        local_b8 = local_90 + local_74;
      }
    }
    if ((ip_00 < pBVar4) && (ip_00 = pBVar4, (BYTE *)(ulong)(local_dc - local_74) < pBVar4)) {
      local_dc = local_74 + (int)pBVar4;
    }
    if (local_28 + (long)pBVar4 == local_30) goto LAB_003e3d2a;
    if (local_b8[(long)pBVar4] < pBVar4[(long)local_28]) {
      *local_c8 = local_74;
      local_80 = pBVar4;
      if (local_74 <= local_c0) {
        local_c8 = &local_d4;
        goto LAB_003e3d2a;
      }
      local_c8 = iEnd + 1;
      local_74 = iEnd[1];
    }
    else {
      *local_d0 = local_74;
      local_88 = pBVar4;
      if (local_74 <= local_c0) {
        local_d0 = &local_d4;
        goto LAB_003e3d2a;
      }
      local_74 = *iEnd;
      local_d0 = iEnd;
    }
    iVar2 = iVar2 + -1;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                const ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const target,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    /* windowLow is based on target because
     * we only need positions that will be in the window at the end of the tree update.
     */
    U32 const windowLow = ZSTD_getLowestMatchIndex(ms, target, cParams->windowLog);
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(curr <= target);
    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    for (; nbCompares && (matchIndex >= windowLow); --nbCompares) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}